

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_dplx_msg.c
# Opt level: O0

_Bool xdr_reply_decode(XDR *xdrs,rpc_msg *dmsg,int32_t *buf)

{
  _Bool _Var1;
  reply_stat rVar2;
  accept_stat aVar3;
  uint32_t uVar4;
  anon_union_432_2_d8689e7e_for_ru *paVar5;
  rejected_reply *rr;
  accepted_reply *ar;
  int32_t *buf_local;
  rpc_msg *dmsg_local;
  XDR *xdrs_local;
  
  if (buf == (int32_t *)0x0) {
    if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u non-INLINE","xdr_reply_decode",0x126);
    }
    _Var1 = xdr_getenum(xdrs,(enum_t *)&(dmsg->ru).RM_rmb);
    if (!_Var1) {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR rm_reply.rp_stat","xdr_reply_decode",0x12a);
      }
      return false;
    }
    ar = (accepted_reply *)0x0;
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u INLINE","xdr_reply_decode",0x121);
    }
    ar = (accepted_reply *)(buf + 1);
    rVar2 = ntohl(*buf);
    (dmsg->ru).RM_rmb.rp_stat = rVar2;
  }
  rVar2 = (dmsg->ru).RM_rmb.rp_stat;
  if (rVar2 == MSG_ACCEPTED) {
    paVar5 = &(dmsg->ru).RM_rmb.ru;
    _Var1 = xdr_opaque_auth_decode(xdrs,&(dmsg->ru).RM_rmb.ru.RP_ar.ar_verf,(int32_t *)ar);
    if (_Var1) {
      _Var1 = xdr_getenum(xdrs,(enum_t *)paVar5);
      if (_Var1) {
        switch((paVar5->RP_ar).ar_stat) {
        case SUCCESS:
          if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u SUCCESS","xdr_reply_decode",0x147);
          }
          xdrs_local._7_1_ = true;
          break;
        case PROG_UNAVAIL:
        case PROC_UNAVAIL:
        case GARBAGE_ARGS:
        case SYSTEM_ERR:
switchD_00118fa4_caseD_1:
        default:
          xdrs_local._7_1_ = true;
          break;
        case PROG_MISMATCH:
          if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u MISMATCH","xdr_reply_decode",0x14d);
          }
          _Var1 = xdr_getuint32(xdrs,(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8));
          if (_Var1) {
            _Var1 = xdr_getuint32(xdrs,(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 0xc));
            if (_Var1) goto switchD_00118fa4_caseD_1;
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR ar_vers.high","xdr_reply_decode",0x157);
            }
            xdrs_local._7_1_ = false;
          }
          else {
            if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
              (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR ar_vers.low","xdr_reply_decode",0x151);
            }
            xdrs_local._7_1_ = false;
          }
        }
      }
      else {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR ar_stat","xdr_reply_decode",0x13f);
        }
        xdrs_local._7_1_ = false;
      }
    }
    else {
      if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR (return)","xdr_reply_decode",0x138);
      }
      xdrs_local._7_1_ = false;
    }
  }
  else if (rVar2 == MSG_DENIED) {
    paVar5 = &(dmsg->ru).RM_rmb.ru;
    if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u MSG_DENIED not verified","xdr_reply_decode",0x16e);
    }
    if (ar == (accepted_reply *)0x0) {
      _Var1 = xdr_getenum(xdrs,(enum_t *)paVar5);
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR rj_stat","xdr_reply_decode",0x175);
        }
        return false;
      }
    }
    else {
      aVar3 = ntohl(ar->ar_stat);
      (paVar5->RP_ar).ar_stat = aVar3;
      ar = (accepted_reply *)&ar->field_0x4;
    }
    if ((paVar5->RP_ar).ar_stat == SUCCESS) {
      if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED MISMATCH","xdr_reply_decode",0x17d);
      }
      if (ar == (accepted_reply *)0x0) {
        _Var1 = xdr_getuint32(xdrs,(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4));
        if (!_Var1) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR rj_vers.low","xdr_reply_decode",0x183);
          }
          return false;
        }
      }
      else {
        uVar4 = ntohl(ar->ar_stat);
        *(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4) = uVar4;
      }
      _Var1 = xdr_getuint32(xdrs,(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 8));
      if (!_Var1) {
        if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
          (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR rj_vers.high","xdr_reply_decode",0x189);
        }
        return false;
      }
    }
    else if ((paVar5->RP_ar).ar_stat == PROG_UNAVAIL) {
      if ((__ntirpc_pkg_params.debug_flags & 0x2000000) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u DENIED AUTH","xdr_reply_decode",0x191);
      }
      if (ar == (accepted_reply *)0x0) {
        _Var1 = xdr_getenum(xdrs,(enum_t *)((long)&(dmsg->ru).RM_rmb.ru + 4));
        if (!_Var1) {
          if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
            (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR rj_why","xdr_reply_decode",0x198);
          }
          return false;
        }
      }
      else {
        uVar4 = ntohl(ar->ar_stat);
        *(uint32_t *)((long)&(dmsg->ru).RM_rmb.ru + 4) = uVar4;
      }
    }
    xdrs_local._7_1_ = true;
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR dmsg->rm_reply.rp_stat %u","xdr_reply_decode",0x1a2,
                 (ulong)(dmsg->ru).RM_rmb.rp_stat);
    }
    xdrs_local._7_1_ = false;
  }
  return xdrs_local._7_1_;
}

Assistant:

bool
xdr_reply_decode(XDR *xdrs, struct rpc_msg *dmsg, int32_t *buf)
{
	if (buf != NULL) {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u INLINE",
			__func__, __LINE__);
		dmsg->rm_reply.rp_stat = IXDR_GET_ENUM(buf, enum_t);
	} else {
		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u non-INLINE",
			__func__, __LINE__);
		if (!xdr_getenum(xdrs, (enum_t *)&(dmsg->rm_reply.rp_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rm_reply.rp_stat",
				__func__, __LINE__);
			return (false);
		}
	}

	switch (dmsg->rm_reply.rp_stat) {
	case MSG_ACCEPTED:
	{
		struct accepted_reply *ar = (struct accepted_reply *)
						&(dmsg->rm_reply.ru);

		if (!xdr_opaque_auth_decode(xdrs, &ar->ar_verf, buf)) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR (return)",
				__func__, __LINE__);
			return (false);
		}

		if (!xdr_getenum(xdrs, (enum_t *)&(ar->ar_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR ar_stat",
				__func__, __LINE__);
			return (false);
		}

		switch (ar->ar_stat) {
		case SUCCESS:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u SUCCESS",
				__func__, __LINE__);
			return (true);

		case PROG_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u MISMATCH",
				__func__, __LINE__);
			if (!xdr_getuint32(xdrs, &(ar->ar_vers.low))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR ar_vers.low",
					__func__, __LINE__);
				return (false);
			}
			if (!xdr_getuint32(xdrs, &(ar->ar_vers.high))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR ar_vers.high",
					__func__, __LINE__);
				return (false);
			}

		case GARBAGE_ARGS:
		case SYSTEM_ERR:
		case PROC_UNAVAIL:
		case PROG_UNAVAIL:
			/* true */
			break;
		default:
			break;
		};	/* ar_stat */
		return (true);
	}	/* MSG_ACCEPTED */
	case MSG_DENIED:
	{
		/* XXX branch not verified */
		struct rejected_reply *rr = (struct rejected_reply *)
						&(dmsg->rm_reply.ru);

		__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
			"%s:%u MSG_DENIED not verified",
			__func__, __LINE__);

		if (buf != NULL) {
			rr->rj_stat = IXDR_GET_ENUM(buf, enum_t);
		} else if (!xdr_getenum(xdrs, (enum_t *)&(rr->rj_stat))) {
			__warnx(TIRPC_DEBUG_FLAG_ERROR,
				"%s:%u ERROR rj_stat",
				__func__, __LINE__);
			return (false);
		}

		switch (rr->rj_stat) {
		case RPC_MISMATCH:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED MISMATCH",
				__func__, __LINE__);
			if (buf != NULL) {
				rr->rj_vers.low = IXDR_GET_U_INT32(buf);
			} else if (!xdr_getuint32(xdrs, &(rr->rj_vers.low))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.low",
					__func__, __LINE__);
				return (false);
			}
			if (!xdr_getuint32(xdrs, &(rr->rj_vers.high))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_vers.high",
					__func__, __LINE__);
				return (false);
			}
			break;

		case AUTH_ERROR:
			__warnx(TIRPC_DEBUG_FLAG_RPC_MSG,
				"%s:%u DENIED AUTH",
				__func__, __LINE__);
			if (buf != NULL) {
				rr->rj_why = IXDR_GET_ENUM(buf, enum_t);
			} else if (!xdr_getenum(xdrs,
					(enum_t *)&(rr->rj_why))) {
				__warnx(TIRPC_DEBUG_FLAG_ERROR,
					"%s:%u ERROR rj_why",
					__func__, __LINE__);
				return (false);
			}
			break;
		};
		return (true);
	}	/* MSG_DENIED */
	default:
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR dmsg->rm_reply.rp_stat %u",
			__func__, __LINE__,
			dmsg->rm_reply.rp_stat);
		break;
	};	/* rm_reply.rp_stat */

	return (false);
}